

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

int SUNHashMap_Iterate(SUNHashMap map,int start,_func_int_int_SUNHashMapKeyValue_void_ptr *yieldfn,
                      void *ctx)

{
  int iVar1;
  undefined8 in_RCX;
  code *in_RDX;
  int in_ESI;
  long in_RDI;
  int retval;
  int i;
  int local_2c;
  int local_4;
  
  if ((in_RDI == 0) || (local_2c = in_ESI, in_RDX == (code *)0x0)) {
    local_4 = -2;
  }
  else {
    for (; local_2c < *(int *)(in_RDI + 4); local_2c = local_2c + 1) {
      iVar1 = (*in_RDX)(local_2c,*(undefined8 *)(*(long *)(in_RDI + 8) + (long)local_2c * 8),in_RCX)
      ;
      if (-1 < iVar1) {
        return iVar1;
      }
      if (iVar1 < -1) {
        return iVar1;
      }
    }
    local_4 = *(int *)(in_RDI + 4);
  }
  return local_4;
}

Assistant:

int SUNHashMap_Iterate(SUNHashMap map, int start,
                       int (*yieldfn)(int, SUNHashMapKeyValue, const void*),
                       const void* ctx)
{
  int i;

  if (map == NULL || yieldfn == NULL) { return (-2); }

  for (i = start; i < map->max_size; i++)
  {
    int retval = yieldfn(i, map->buckets[i], ctx);
    if (retval >= 0)
    {
      return (retval); /* yieldfn indicates the loop should break */
    }
    if (retval < -1) { return (retval); /* error occurred */ }
  }

  return (map->max_size);
}